

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerInvulnerable::InitEffect(APowerInvulnerable *this)

{
  byte *pbVar1;
  ActorFlags2 *pAVar2;
  int iVar3;
  PClass *pPVar4;
  undefined4 extraout_var;
  AActor *pAVar6;
  bool bVar7;
  PClass *pPVar5;
  
  pAVar6 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  pAVar6->effects = pAVar6->effects & 0xffffffdf;
  pbVar1 = (byte *)((long)&(pAVar6->flags2).Value + 3);
  *pbVar1 = *pbVar1 | 8;
  pPVar5 = APlayerPawn::RegistrationInfo.MyClass;
  iVar3 = (this->super_APowerup).Mode.super_FName.Index;
  if (iVar3 != 0) goto LAB_004a15de;
  pPVar4 = (pAVar6->super_DThinker).super_DObject.Class;
  if (pPVar4 == (PClass *)0x0) {
    pPVar4 = (PClass *)(**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
    (pAVar6->super_DThinker).super_DObject.Class = pPVar4;
  }
  bVar7 = pPVar4 != (PClass *)0x0;
  if (pPVar4 != pPVar5 && bVar7) {
    do {
      pPVar4 = pPVar4->ParentClass;
      bVar7 = pPVar4 != (PClass *)0x0;
      if (pPVar4 == pPVar5) break;
    } while (pPVar4 != (PClass *)0x0);
  }
  if (!bVar7) {
    iVar3 = (this->super_APowerup).Mode.super_FName.Index;
    goto LAB_004a15de;
  }
  pAVar6 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar6 == (AActor *)0x0) {
LAB_004a15b2:
    pAVar6 = (AActor *)0x0;
  }
  else if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    goto LAB_004a15b2;
  }
  pPVar5 = (pAVar6->super_DThinker).super_DObject.Class;
  if (pPVar5 == (PClass *)0x0) {
    iVar3 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
    pPVar5 = (PClass *)CONCAT44(extraout_var,iVar3);
    (pAVar6->super_DThinker).super_DObject.Class = pPVar5;
  }
  iVar3 = *(int *)&pPVar5[2].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
                   super_PType.Symbols.Symbols.Nodes;
  (this->super_APowerup).Mode.super_FName.Index = iVar3;
LAB_004a15de:
  if (iVar3 == 0x12) {
    pAVar2 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags2;
    pAVar2->Value = pAVar2->Value | 0x80000000;
  }
  return;
}

Assistant:

void APowerInvulnerable::InitEffect ()
{
	Super::InitEffect();
	Owner->effects &= ~FX_RESPAWNINVUL;
	Owner->flags2 |= MF2_INVULNERABLE;
	if (Mode == NAME_None && Owner->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{
		Mode = static_cast<PClassPlayerPawn *>(Owner->GetClass())->InvulMode;
	}
	if (Mode == NAME_Reflective)
	{
		Owner->flags2 |= MF2_REFLECTIVE;
	}
}